

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::moveColumnsTreeSameBranch(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ModelTest *this_00;
  QModelIndex *this_01;
  QArrayDataPointer<QVariant> *pQVar7;
  long lVar8;
  QModelIndex local_220;
  QArrayDataPointer<char16_t> local_208;
  value_type args;
  QArrayDataPointer<char16_t> local_1c8;
  QModelIndex local_1b0;
  QModelIndex parIndex;
  GenericModel testModel;
  long local_168;
  QPersistentModelIndex oneTwoIndex;
  QSignalSpy *spyArr [2];
  QPersistentModelIndex oneOneIndex;
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy columnsMovedSpy;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  this_00 = &probe;
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  fillTable((tst_GenericModel *)this_00,(QAbstractItemModel *)&testModel,2,6,
            (QModelIndex *)&rowsAboutToBeMovedSpy,0);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  this_01 = &parIndex;
  GenericModel::index((int)this_01,(int)&testModel,(QModelIndex *)0x1);
  fillTable((tst_GenericModel *)this_01,(QAbstractItemModel *)&testModel,2,6,&parIndex,0);
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeMovedSpy,(QObject *)&testModel,
             "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsAboutToBeMovedSpy.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x883);
  if (cVar2 == '\0') goto LAB_0012b82e;
  QSignalSpy::QSignalSpy
            (&columnsMovedSpy,(QObject *)&testModel,
             "2columnsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(columnsMovedSpy.sig.d.size != 0,"columnsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x885);
  if (cVar2 != '\0') {
    spyArr[0] = &rowsAboutToBeMovedSpy;
    spyArr[1] = &columnsMovedSpy;
    bVar3 = GenericModel::moveColumns
                      ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,(int)&parIndex)
    ;
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveColumns(parIndex, 2, 1, parIndex, -1)",
                           "",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x888);
    if (cVar2 != '\0') {
      lVar8 = 0;
      do {
        if (lVar8 == 0x10) {
          bVar3 = GenericModel::moveColumns
                            ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                             (int)&parIndex);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveColumns(parIndex, 2, 1, parIndex, 7)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x88b);
          if (cVar2 != '\0') {
            lVar8 = 0;
            goto LAB_00129102;
          }
          break;
        }
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x88a);
        lVar8 = lVar8 + 8;
      } while (cVar2 != '\0');
    }
  }
  goto LAB_0012b821;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x88d);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_00129102:
    if (lVar8 == 0x10) {
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&parIndex,-1,(QModelIndex *)0x1,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveColumns(parIndex, -1, 1, parIndex, 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x88e);
      if (cVar2 != '\0') {
        lVar8 = 0;
        goto LAB_0012919e;
      }
      break;
    }
  }
  goto LAB_0012b821;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x890);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_0012919e:
    if (lVar8 == 0x10) {
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&parIndex,6,(QModelIndex *)0x1,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveColumns(parIndex, 6, 1, parIndex, 3)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x891);
      if (cVar2 != '\0') {
        lVar8 = 0;
        goto LAB_0012923a;
      }
      break;
    }
  }
  goto LAB_0012b821;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x893);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_0012923a:
    if (lVar8 == 0x10) {
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&parIndex,1,(QModelIndex *)0x2,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveColumns(parIndex, 1, 2, parIndex, 2)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x894);
      if (cVar2 != '\0') {
        lVar8 = 0;
        goto LAB_001292d5;
      }
      break;
    }
  }
  goto LAB_0012b821;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x896);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_001292d5:
    if (lVar8 == 0x10) {
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&parIndex,1,(QModelIndex *)0x2,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveColumns(parIndex, 1, 2, parIndex, 3)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x897);
      if (cVar2 != '\0') {
        lVar8 = 0;
        goto LAB_00129371;
      }
      break;
    }
  }
  goto LAB_0012b821;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x899);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_00129371:
    if (lVar8 == 0x10) {
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex(&oneTwoIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                               (int)&parIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(parIndex, 2, 1, parIndex, 4)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x89c);
      if (cVar2 == '\0') goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,0";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 0, parIndex).data().toString()",
                              "QStringLiteral(\"0,0\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x89d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,1";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 1, parIndex).data().toString()",
                              "QStringLiteral(\"0,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x89e);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,3";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 2, parIndex).data().toString()",
                              "QStringLiteral(\"0,3\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x89f);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,2";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 3, parIndex).data().toString()",
                              "QStringLiteral(\"0,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,4";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 4, parIndex).data().toString()",
                              "QStringLiteral(\"0,4\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,5";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 5, parIndex).data().toString()",
                              "QStringLiteral(\"0,5\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,0";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 0, parIndex).data().toString()",
                              "QStringLiteral(\"1,0\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,1";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 1, parIndex).data().toString()",
                              "QStringLiteral(\"1,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a4);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,3";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 2, parIndex).data().toString()",
                              "QStringLiteral(\"1,3\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a5);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,2";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 3, parIndex).data().toString()",
                              "QStringLiteral(\"1,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,4";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 4, parIndex).data().toString()",
                              "QStringLiteral(\"1,4\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a7);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,5";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 5, parIndex).data().toString()",
                              "QStringLiteral(\"1,5\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      QPersistentModelIndex::data((int)&args);
      QVariant::toString();
      local_1b0.r = 0;
      local_1b0.c = 0;
      local_1b0.i = 0x14a994;
      local_1b0.m = (QAbstractItemModel *)0x3;
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = (char16_t *)0x0;
      local_1c8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1b0,
                              "oneTwoIndex.data().toString()","QStringLiteral(\"1,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8a9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012b814;
      uVar5 = QPersistentModelIndex::column();
      pQVar7 = (QArrayDataPointer<QVariant> *)(ulong)uVar5;
      cVar2 = QTest::qCompare(uVar5,3,"oneTwoIndex.column()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8aa);
      if (cVar2 == '\0') goto LAB_0012b814;
      local_168 = 0;
      goto LAB_00129e12;
    }
  }
  goto LAB_0012b821;
  while( true ) {
    lVar8 = *(long *)((long)spyArr + local_168);
    cVar2 = QTest::qCompare(*(longlong *)(lVar8 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8ac);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar8 + 0x10));
    qvariant_cast<QModelIndex>(&local_220,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_220,&parIndex,"args.at(0).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x8ae);
    if (!bVar4) goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8af);
    if (cVar2 == '\0') goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8b0);
    if (cVar2 == '\0') goto LAB_0012b80a;
    qvariant_cast<QModelIndex>(&local_220,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_220,&parIndex,"args.at(3).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x8b1);
    if (!bVar4) goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar6,4,"args.at(4).toInt()","4",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8b2);
    pQVar7 = &args.d;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(pQVar7);
    local_168 = local_168 + 8;
    if (cVar2 == '\0') break;
LAB_00129e12:
    if (local_168 == 0x10) {
      fillTable((tst_GenericModel *)pQVar7,(QAbstractItemModel *)&testModel,2,6,&parIndex,0);
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::operator=(&oneTwoIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                               (int)&parIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(parIndex, 2, 1, parIndex, 0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x8b7);
      if (cVar2 != '\0') {
        GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&args,&local_1b0,0);
        QVariant::toString();
        local_1c8.d = (Data *)0x0;
        local_1c8.ptr = L"0,2";
        local_1c8.size = 3;
        local_208.d = (Data *)0x0;
        local_208.ptr = (char16_t *)0x0;
        local_208.size = 0;
        bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                "testModel.index(0, 0, parIndex).data().toString()",
                                "QStringLiteral(\"0,2\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x8b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
        QVariant::~QVariant((QVariant *)&args);
        if (bVar4) {
          GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
          QModelIndex::data((QVariant *)&args,&local_1b0,0);
          QVariant::toString();
          local_1c8.d = (Data *)0x0;
          local_1c8.ptr = L"0,0";
          local_1c8.size = 3;
          local_208.d = (Data *)0x0;
          local_208.ptr = (char16_t *)0x0;
          local_208.size = 0;
          bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                  "testModel.index(0, 1, parIndex).data().toString()",
                                  "QStringLiteral(\"0,0\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x8b9);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220)
          ;
          QVariant::~QVariant((QVariant *)&args);
          if (bVar4) {
            GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
            QModelIndex::data((QVariant *)&args,&local_1b0,0);
            QVariant::toString();
            local_1c8.d = (Data *)0x0;
            local_1c8.ptr = L"0,1";
            local_1c8.size = 3;
            local_208.d = (Data *)0x0;
            local_208.ptr = (char16_t *)0x0;
            local_208.size = 0;
            bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                    "testModel.index(0, 2, parIndex).data().toString()",
                                    "QStringLiteral(\"0,1\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x8ba);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_220);
            QVariant::~QVariant((QVariant *)&args);
            if (bVar4) {
              GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
              QModelIndex::data((QVariant *)&args,&local_1b0,0);
              QVariant::toString();
              local_1c8.d = (Data *)0x0;
              local_1c8.ptr = L"0,3";
              local_1c8.size = 3;
              local_208.d = (Data *)0x0;
              local_208.ptr = (char16_t *)0x0;
              local_208.size = 0;
              bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                      "testModel.index(0, 3, parIndex).data().toString()",
                                      "QStringLiteral(\"0,3\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x8bb);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_220);
              QVariant::~QVariant((QVariant *)&args);
              if (bVar4) {
                GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
                QModelIndex::data((QVariant *)&args,&local_1b0,0);
                QVariant::toString();
                local_1c8.d = (Data *)0x0;
                local_1c8.ptr = L"0,4";
                local_1c8.size = 3;
                local_208.d = (Data *)0x0;
                local_208.ptr = (char16_t *)0x0;
                local_208.size = 0;
                bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                        "testModel.index(0, 4, parIndex).data().toString()",
                                        "QStringLiteral(\"0,4\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x8bc);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_220);
                QVariant::~QVariant((QVariant *)&args);
                if (bVar4) {
                  GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
                  QModelIndex::data((QVariant *)&args,&local_1b0,0);
                  QVariant::toString();
                  local_1c8.d = (Data *)0x0;
                  local_1c8.ptr = L"0,5";
                  local_1c8.size = 3;
                  local_208.d = (Data *)0x0;
                  local_208.ptr = (char16_t *)0x0;
                  local_208.size = 0;
                  bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                          "testModel.index(0, 5, parIndex).data().toString()",
                                          "QStringLiteral(\"0,5\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x8bd);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_220);
                  QVariant::~QVariant((QVariant *)&args);
                  if (bVar4) {
                    GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                    QModelIndex::data((QVariant *)&args,&local_1b0,0);
                    QVariant::toString();
                    local_1c8.d = (Data *)0x0;
                    local_1c8.ptr = L"1,2";
                    local_1c8.size = 3;
                    local_208.d = (Data *)0x0;
                    local_208.ptr = (char16_t *)0x0;
                    local_208.size = 0;
                    bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                            "testModel.index(1, 0, parIndex).data().toString()",
                                            "QStringLiteral(\"1,2\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x8be);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_220);
                    QVariant::~QVariant((QVariant *)&args);
                    if (bVar4) {
                      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                      QModelIndex::data((QVariant *)&args,&local_1b0,0);
                      QVariant::toString();
                      local_1c8.d = (Data *)0x0;
                      local_1c8.ptr = L"1,0";
                      local_1c8.size = 3;
                      local_208.d = (Data *)0x0;
                      local_208.ptr = (char16_t *)0x0;
                      local_208.size = 0;
                      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                              "testModel.index(1, 1, parIndex).data().toString()",
                                              "QStringLiteral(\"1,0\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x8bf);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_220);
                      QVariant::~QVariant((QVariant *)&args);
                      if (bVar4) {
                        GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                        QModelIndex::data((QVariant *)&args,&local_1b0,0);
                        QVariant::toString();
                        local_1c8.d = (Data *)0x0;
                        local_1c8.ptr = L"1,1";
                        local_1c8.size = 3;
                        local_208.d = (Data *)0x0;
                        local_208.ptr = (char16_t *)0x0;
                        local_208.size = 0;
                        bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                                "testModel.index(1, 2, parIndex).data().toString()",
                                                "QStringLiteral(\"1,1\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x8c0);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)&local_220);
                        QVariant::~QVariant((QVariant *)&args);
                        if (bVar4) {
                          GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                          QModelIndex::data((QVariant *)&args,&local_1b0,0);
                          QVariant::toString();
                          local_1c8.d = (Data *)0x0;
                          local_1c8.ptr = L"1,3";
                          local_1c8.size = 3;
                          local_208.d = (Data *)0x0;
                          local_208.ptr = (char16_t *)0x0;
                          local_208.size = 0;
                          bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c1);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                    ((QArrayDataPointer<char16_t> *)&local_220);
                          QVariant::~QVariant((QVariant *)&args);
                          if (bVar4) {
                            GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                            QModelIndex::data((QVariant *)&args,&local_1b0,0);
                            QVariant::toString();
                            local_1c8.d = (Data *)0x0;
                            local_1c8.ptr = L"1,4";
                            local_1c8.size = 3;
                            local_208.d = (Data *)0x0;
                            local_208.ptr = (char16_t *)0x0;
                            local_208.size = 0;
                            bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                                                                                        
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c2);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)&local_220);
                            QVariant::~QVariant((QVariant *)&args);
                            if (bVar4) {
                              GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1
                                                 );
                              QModelIndex::data((QVariant *)&args,&local_1b0,0);
                              QVariant::toString();
                              local_1c8.d = (Data *)0x0;
                              local_1c8.ptr = L"1,5";
                              local_1c8.size = 3;
                              local_208.d = (Data *)0x0;
                              local_208.ptr = (char16_t *)0x0;
                              local_208.size = 0;
                              bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                                                                                            
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c3);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                        ((QArrayDataPointer<char16_t> *)&local_220);
                              QVariant::~QVariant((QVariant *)&args);
                              if (bVar4) {
                                QPersistentModelIndex::data((int)&args);
                                QVariant::toString();
                                local_1b0.r = 0;
                                local_1b0.c = 0;
                                local_1b0.i = 0x14a994;
                                local_1b0.m = (QAbstractItemModel *)0x3;
                                local_1c8.d = (Data *)0x0;
                                local_1c8.ptr = (char16_t *)0x0;
                                local_1c8.size = 0;
                                bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1b0,
                                                        "oneTwoIndex.data().toString()",
                                                        "QStringLiteral(\"1,2\")",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c4);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_1b0);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_220);
                                QVariant::~QVariant((QVariant *)&args);
                                if (bVar4) {
                                  uVar5 = QPersistentModelIndex::column();
                                  pQVar7 = (QArrayDataPointer<QVariant> *)(ulong)uVar5;
                                  cVar2 = QTest::qCompare(uVar5,0,"oneTwoIndex.column()","0",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c5);
                                  if (cVar2 != '\0') {
                                    local_168 = 0;
                                    goto LAB_0012aa33;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0012b814;
  while( true ) {
    lVar8 = *(long *)((long)spyArr + local_168);
    cVar2 = QTest::qCompare(*(longlong *)(lVar8 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8c7);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar8 + 0x10));
    qvariant_cast<QModelIndex>(&local_220,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_220,&parIndex,"args.at(0).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x8c9);
    if (!bVar4) goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8ca);
    if (cVar2 == '\0') goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8cb);
    if (cVar2 == '\0') goto LAB_0012b80a;
    qvariant_cast<QModelIndex>(&local_220,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_220,&parIndex,"args.at(3).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x8cc);
    if (!bVar4) goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar6,0,"args.at(4).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8cd);
    pQVar7 = &args.d;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(pQVar7);
    local_168 = local_168 + 8;
    if (cVar2 == '\0') break;
LAB_0012aa33:
    if (local_168 == 0x10) {
      fillTable((tst_GenericModel *)pQVar7,(QAbstractItemModel *)&testModel,2,6,&parIndex,0);
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::operator=(&oneTwoIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                               (int)&parIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(parIndex, 2, 1, parIndex, 6)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x8d2);
      if (cVar2 != '\0') {
        GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&args,&local_1b0,0);
        QVariant::toString();
        local_1c8.d = (Data *)0x0;
        local_1c8.ptr = L"0,0";
        local_1c8.size = 3;
        local_208.d = (Data *)0x0;
        local_208.ptr = (char16_t *)0x0;
        local_208.size = 0;
        bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                "testModel.index(0, 0, parIndex).data().toString()",
                                "QStringLiteral(\"0,0\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x8d3);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
        QVariant::~QVariant((QVariant *)&args);
        if (bVar4) {
          GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
          QModelIndex::data((QVariant *)&args,&local_1b0,0);
          QVariant::toString();
          local_1c8.d = (Data *)0x0;
          local_1c8.ptr = L"0,1";
          local_1c8.size = 3;
          local_208.d = (Data *)0x0;
          local_208.ptr = (char16_t *)0x0;
          local_208.size = 0;
          bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                  "testModel.index(0, 1, parIndex).data().toString()",
                                  "QStringLiteral(\"0,1\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x8d4);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220)
          ;
          QVariant::~QVariant((QVariant *)&args);
          if (bVar4) {
            GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
            QModelIndex::data((QVariant *)&args,&local_1b0,0);
            QVariant::toString();
            local_1c8.d = (Data *)0x0;
            local_1c8.ptr = L"0,3";
            local_1c8.size = 3;
            local_208.d = (Data *)0x0;
            local_208.ptr = (char16_t *)0x0;
            local_208.size = 0;
            bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                    "testModel.index(0, 2, parIndex).data().toString()",
                                    "QStringLiteral(\"0,3\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x8d5);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_220);
            QVariant::~QVariant((QVariant *)&args);
            if (bVar4) {
              GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
              QModelIndex::data((QVariant *)&args,&local_1b0,0);
              QVariant::toString();
              local_1c8.d = (Data *)0x0;
              local_1c8.ptr = L"0,4";
              local_1c8.size = 3;
              local_208.d = (Data *)0x0;
              local_208.ptr = (char16_t *)0x0;
              local_208.size = 0;
              bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                      "testModel.index(0, 3, parIndex).data().toString()",
                                      "QStringLiteral(\"0,4\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x8d6);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_220);
              QVariant::~QVariant((QVariant *)&args);
              if (bVar4) {
                GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
                QModelIndex::data((QVariant *)&args,&local_1b0,0);
                QVariant::toString();
                local_1c8.d = (Data *)0x0;
                local_1c8.ptr = L"0,5";
                local_1c8.size = 3;
                local_208.d = (Data *)0x0;
                local_208.ptr = (char16_t *)0x0;
                local_208.size = 0;
                bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                        "testModel.index(0, 4, parIndex).data().toString()",
                                        "QStringLiteral(\"0,5\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x8d7);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_220);
                QVariant::~QVariant((QVariant *)&args);
                if (bVar4) {
                  GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
                  QModelIndex::data((QVariant *)&args,&local_1b0,0);
                  QVariant::toString();
                  local_1c8.d = (Data *)0x0;
                  local_1c8.ptr = L"0,2";
                  local_1c8.size = 3;
                  local_208.d = (Data *)0x0;
                  local_208.ptr = (char16_t *)0x0;
                  local_208.size = 0;
                  bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                          "testModel.index(0, 5, parIndex).data().toString()",
                                          "QStringLiteral(\"0,2\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x8d8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_220);
                  QVariant::~QVariant((QVariant *)&args);
                  if (bVar4) {
                    GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                    QModelIndex::data((QVariant *)&args,&local_1b0,0);
                    QVariant::toString();
                    local_1c8.d = (Data *)0x0;
                    local_1c8.ptr = L"1,0";
                    local_1c8.size = 3;
                    local_208.d = (Data *)0x0;
                    local_208.ptr = (char16_t *)0x0;
                    local_208.size = 0;
                    bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                            "testModel.index(1, 0, parIndex).data().toString()",
                                            "QStringLiteral(\"1,0\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x8d9);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_220);
                    QVariant::~QVariant((QVariant *)&args);
                    if (bVar4) {
                      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                      QModelIndex::data((QVariant *)&args,&local_1b0,0);
                      QVariant::toString();
                      local_1c8.d = (Data *)0x0;
                      local_1c8.ptr = L"1,1";
                      local_1c8.size = 3;
                      local_208.d = (Data *)0x0;
                      local_208.ptr = (char16_t *)0x0;
                      local_208.size = 0;
                      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                              "testModel.index(1, 1, parIndex).data().toString()",
                                              "QStringLiteral(\"1,1\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x8da);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_220);
                      QVariant::~QVariant((QVariant *)&args);
                      if (bVar4) {
                        GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                        QModelIndex::data((QVariant *)&args,&local_1b0,0);
                        QVariant::toString();
                        local_1c8.d = (Data *)0x0;
                        local_1c8.ptr = L"1,3";
                        local_1c8.size = 3;
                        local_208.d = (Data *)0x0;
                        local_208.ptr = (char16_t *)0x0;
                        local_208.size = 0;
                        bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                                "testModel.index(1, 2, parIndex).data().toString()",
                                                "QStringLiteral(\"1,3\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x8db);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)&local_220);
                        QVariant::~QVariant((QVariant *)&args);
                        if (bVar4) {
                          GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                          QModelIndex::data((QVariant *)&args,&local_1b0,0);
                          QVariant::toString();
                          local_1c8.d = (Data *)0x0;
                          local_1c8.ptr = L"1,4";
                          local_1c8.size = 3;
                          local_208.d = (Data *)0x0;
                          local_208.ptr = (char16_t *)0x0;
                          local_208.size = 0;
                          bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8dc);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                    ((QArrayDataPointer<char16_t> *)&local_220);
                          QVariant::~QVariant((QVariant *)&args);
                          if (bVar4) {
                            GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
                            QModelIndex::data((QVariant *)&args,&local_1b0,0);
                            QVariant::toString();
                            local_1c8.d = (Data *)0x0;
                            local_1c8.ptr = L"1,5";
                            local_1c8.size = 3;
                            local_208.d = (Data *)0x0;
                            local_208.ptr = (char16_t *)0x0;
                            local_208.size = 0;
                            bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                                                                                        
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8dd);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)&local_220);
                            QVariant::~QVariant((QVariant *)&args);
                            if (bVar4) {
                              GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1
                                                 );
                              QModelIndex::data((QVariant *)&args,&local_1b0,0);
                              QVariant::toString();
                              local_1c8.d = (Data *)0x0;
                              local_1c8.ptr = L"1,2";
                              local_1c8.size = 3;
                              local_208.d = (Data *)0x0;
                              local_208.ptr = (char16_t *)0x0;
                              local_208.size = 0;
                              bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                                                                                                            
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8de);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                        ((QArrayDataPointer<char16_t> *)&local_220);
                              QVariant::~QVariant((QVariant *)&args);
                              if (bVar4) {
                                QPersistentModelIndex::data((int)&args);
                                QVariant::toString();
                                local_1b0.r = 0;
                                local_1b0.c = 0;
                                local_1b0.i = 0x14a994;
                                local_1b0.m = (QAbstractItemModel *)0x3;
                                local_1c8.d = (Data *)0x0;
                                local_1c8.ptr = (char16_t *)0x0;
                                local_1c8.size = 0;
                                bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1b0,
                                                        "oneTwoIndex.data().toString()",
                                                        "QStringLiteral(\"1,2\")",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8df);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_1b0);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_220);
                                QVariant::~QVariant((QVariant *)&args);
                                if (bVar4) {
                                  uVar5 = QPersistentModelIndex::column();
                                  pQVar7 = (QArrayDataPointer<QVariant> *)(ulong)uVar5;
                                  cVar2 = QTest::qCompare(uVar5,5,"oneTwoIndex.column()","5",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e0);
                                  if (cVar2 != '\0') {
                                    local_168 = 0;
                                    goto LAB_0012b655;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0012b814;
  while( true ) {
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar8 + 0x10));
    qvariant_cast<QModelIndex>(&local_220,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_220,&parIndex,"args.at(0).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x8e4);
    if (!bVar4) goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8e5);
    if (cVar2 == '\0') goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8e6);
    if (cVar2 == '\0') goto LAB_0012b80a;
    qvariant_cast<QModelIndex>(&local_220,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_220,&parIndex,"args.at(3).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x8e7);
    if (!bVar4) goto LAB_0012b80a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar6,6,"args.at(4).toInt()","6",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8e8);
    pQVar7 = &args.d;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(pQVar7);
    local_168 = local_168 + 8;
    if (cVar2 == '\0') break;
LAB_0012b655:
    if (local_168 == 0x10) {
      fillTable((tst_GenericModel *)pQVar7,(QAbstractItemModel *)&testModel,2,6,&parIndex,0);
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex(&oneOneIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&parIndex,0,(QModelIndex *)0x2,
                               (int)&parIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(parIndex, 0, 2, parIndex, 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x8ed);
      if (cVar2 == '\0') goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,2";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 0, parIndex).data().toString()",
                              "QStringLiteral(\"0,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8ee);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,0";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 1, parIndex).data().toString()",
                              "QStringLiteral(\"0,0\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8ef);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,1";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 2, parIndex).data().toString()",
                              "QStringLiteral(\"0,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,3";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 3, parIndex).data().toString()",
                              "QStringLiteral(\"0,3\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,4";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 4, parIndex).data().toString()",
                              "QStringLiteral(\"0,4\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"0,5";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(0, 5, parIndex).data().toString()",
                              "QStringLiteral(\"0,5\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,2";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 0, parIndex).data().toString()",
                              "QStringLiteral(\"1,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f4);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,0";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 1, parIndex).data().toString()",
                              "QStringLiteral(\"1,0\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f5);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,1";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 2, parIndex).data().toString()",
                              "QStringLiteral(\"1,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,3";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 3, parIndex).data().toString()",
                              "QStringLiteral(\"1,3\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f7);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,4";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 4, parIndex).data().toString()",
                              "QStringLiteral(\"1,4\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      GenericModel::index((int)&local_1b0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b0,0);
      QVariant::toString();
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"1,5";
      local_1c8.size = 3;
      local_208.d = (Data *)0x0;
      local_208.ptr = (char16_t *)0x0;
      local_208.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1c8,
                              "testModel.index(1, 5, parIndex).data().toString()",
                              "QStringLiteral(\"1,5\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8f9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      QPersistentModelIndex::data((int)&args);
      QVariant::toString();
      local_1b0.r = 0;
      local_1b0.c = 0;
      local_1b0.i = 0x14a984;
      local_1b0.m = (QAbstractItemModel *)0x3;
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = (char16_t *)0x0;
      local_1c8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_220,(QString *)&local_1b0,
                              "oneOneIndex.data().toString()","QStringLiteral(\"1,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8fa);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_220);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0012c45a;
      iVar6 = QPersistentModelIndex::column();
      cVar2 = QTest::qCompare(iVar6,2,"oneOneIndex.column()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x8fb);
      if (cVar2 == '\0') goto LAB_0012c45a;
      lVar8 = 0;
      goto LAB_0012c2de;
    }
    lVar8 = *(long *)((long)spyArr + local_168);
    cVar2 = QTest::qCompare(*(longlong *)(lVar8 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8e2);
    if (cVar2 == '\0') break;
  }
  goto LAB_0012b814;
LAB_0012b80a:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  goto LAB_0012b814;
LAB_0012c2de:
  do {
    if (lVar8 == 0x10) break;
    lVar1 = *(long *)((long)spyArr + lVar8);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x8fd);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_220,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_220,&parIndex,"args.at(0).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x8ff);
    if (!bVar4) {
LAB_0012c450:
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
      break;
    }
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x900);
    if (cVar2 == '\0') goto LAB_0012c450;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar6,1,"args.at(2).toInt()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x901);
    if (cVar2 == '\0') goto LAB_0012c450;
    qvariant_cast<QModelIndex>(&local_220,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_220,&parIndex,"args.at(3).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x902);
    if (!bVar4) goto LAB_0012c450;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar6,3,"args.at(4).toInt()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x903);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar8 = lVar8 + 8;
  } while (cVar2 != '\0');
LAB_0012c45a:
  QPersistentModelIndex::~QPersistentModelIndex(&oneOneIndex);
LAB_0012b814:
  QPersistentModelIndex::~QPersistentModelIndex(&oneTwoIndex);
LAB_0012b821:
  QSignalSpy::~QSignalSpy(&columnsMovedSpy);
LAB_0012b82e:
  QSignalSpy::~QSignalSpy(&rowsAboutToBeMovedSpy);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveColumnsTreeSameBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 2, 6);
    const QModelIndex parIndex = testModel.index(1, 0);
    fillTable(&testModel, 2, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy columnsMovedSpy(&testModel, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(columnsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &columnsMovedSpy};

    QVERIFY(!testModel.moveColumns(parIndex, 2, 1, parIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 2, 1, parIndex, 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, -1, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 6, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 1, 2, parIndex, 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 1, 2, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 4));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 4);
    }

    fillTable(&testModel, 2, 6, parIndex);
    oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 0));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }

    fillTable(&testModel, 2, 6, parIndex);
    oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 6));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 6);
    }

    fillTable(&testModel, 2, 6, parIndex);
    QPersistentModelIndex oneOneIndex = testModel.index(1, 1, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 0, 2, parIndex, 3));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneOneIndex.data().toString(), QStringLiteral("1,1"));
    QCOMPARE(oneOneIndex.column(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 3);
    }
}